

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_export_secret(ptls_t *tls,void *output,size_t outlen,char *label,ptls_iovec_t context_value
                      ,int is_early)

{
  ptls_hash_algorithm_t *algo_00;
  size_t outlen_00;
  ptls_iovec_t pVar1;
  ptls_iovec_t pVar2;
  uint8_t *local_128;
  int local_dc;
  undefined1 local_d8 [4];
  int ret;
  uint8_t context_value_hash [64];
  uint8_t derived_secret [64];
  uint8_t *master_secret;
  ptls_hash_algorithm_t *algo;
  char *label_local;
  size_t outlen_local;
  void *output_local;
  ptls_t *tls_local;
  ptls_iovec_t context_value_local;
  
  algo_00 = tls->key_schedule->hashes[0].algo;
  if (is_early == 0) {
    local_128 = (tls->exporter_master_secret).one_rtt;
  }
  else {
    local_128 = (tls->exporter_master_secret).early;
  }
  if (local_128 == (uint8_t *)0x0) {
    if (is_early == 0) {
      local_dc = 0x202;
    }
    else if ((tls->state & ~PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO) ==
             PTLS_STATE_CLIENT_HANDSHAKE_START) {
      local_dc = 0x202;
    }
    else {
      local_dc = 0x207;
    }
    context_value_local.len._4_4_ = local_dc;
  }
  else {
    context_value_local.len._4_4_ =
         ptls_calc_hash(algo_00,local_d8,context_value.base,context_value.len);
    if (context_value_local.len._4_4_ == 0) {
      outlen_00 = algo_00->digest_size;
      pVar1 = ptls_iovec_init(local_128,algo_00->digest_size);
      pVar2 = ptls_iovec_init(algo_00->empty_digest,algo_00->digest_size);
      local_dc = ptls_hkdf_expand_label
                           (algo_00,context_value_hash + 0x38,outlen_00,pVar1,label,pVar2,
                            (char *)0x0);
      if (local_dc == 0) {
        pVar1 = ptls_iovec_init(context_value_hash + 0x38,algo_00->digest_size);
        pVar2 = ptls_iovec_init(local_d8,algo_00->digest_size);
        local_dc = ptls_hkdf_expand_label(algo_00,output,outlen,pVar1,"exporter",pVar2,(char *)0x0);
      }
      (*ptls_clear_memory)(context_value_hash + 0x38,0x40);
      (*ptls_clear_memory)(local_d8,0x40);
      context_value_local.len._4_4_ = local_dc;
    }
  }
  return context_value_local.len._4_4_;
}

Assistant:

int ptls_export_secret(ptls_t *tls, void *output, size_t outlen, const char *label, ptls_iovec_t context_value, int is_early)
{
    ptls_hash_algorithm_t *algo = tls->key_schedule->hashes[0].algo;
    uint8_t *master_secret = is_early ? tls->exporter_master_secret.early : tls->exporter_master_secret.one_rtt,
            derived_secret[PTLS_MAX_DIGEST_SIZE], context_value_hash[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if (master_secret == NULL) {
        if (is_early) {
            switch (tls->state) {
            case PTLS_STATE_CLIENT_HANDSHAKE_START:
            case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
                ret = PTLS_ERROR_IN_PROGRESS;
                break;
            default:
                ret = PTLS_ERROR_NOT_AVAILABLE;
                break;
            }
        } else {
            ret = PTLS_ERROR_IN_PROGRESS;
        }
        return ret;
    }

    if ((ret = ptls_calc_hash(algo, context_value_hash, context_value.base, context_value.len)) != 0)
        return ret;

    if ((ret = ptls_hkdf_expand_label(algo, derived_secret, algo->digest_size, ptls_iovec_init(master_secret, algo->digest_size),
                                      label, ptls_iovec_init(algo->empty_digest, algo->digest_size), NULL)) != 0)
        goto Exit;
    ret = ptls_hkdf_expand_label(algo, output, outlen, ptls_iovec_init(derived_secret, algo->digest_size), "exporter",
                                 ptls_iovec_init(context_value_hash, algo->digest_size), NULL);

Exit:
    ptls_clear_memory(derived_secret, sizeof(derived_secret));
    ptls_clear_memory(context_value_hash, sizeof(context_value_hash));
    return ret;
}